

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::SetAndReturnNewString_abi_cxx11_(ArenaStringPtr *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  string *new_string;
  ArenaStringPtr *this_local;
  
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)p);
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            (&this->tagged_ptr_,p);
  return p;
}

Assistant:

std::string* ArenaStringPtr::SetAndReturnNewString() {
  std::string* new_string = new std::string();
  tagged_ptr_.Set(new_string);
  return new_string;
}